

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

int __thiscall CTcSymLocal::write_to_debug_frame(CTcSymLocal *this,int test_only)

{
  ushort uVar1;
  CTcCodeStream *this_00;
  uint uVar2;
  uint uVar3;
  CTcStreamAnchor *pCVar4;
  uint uVar5;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  byte bVar6;
  int iVar7;
  CTcCodeStream **ppCVar8;
  size_t __n;
  
  if (test_only == 0) {
    bVar6 = 1;
    if ((2 < (this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
             super_CVmHashEntry.len_) && (1 < G_sizes.dbg_fmt_vsn)) {
      bVar6 = (G_cg->field_0xd0 & 4) >> 2;
    }
    ppCVar8 = &G_cs;
    CTcDataStream::write2
              (&G_cs->super_CTcDataStream,
               *(uint *)((long)&(this->super_CTcSymLocalBase).var_num_ +
                        (ulong)((*(ushort *)&(this->super_CTcSymLocalBase).field_0x64 & 0x10) >> 1))
              );
    uVar1 = *(ushort *)&(this->super_CTcSymLocalBase).field_0x64;
    uVar5 = uVar1 & 1;
    __n = (size_t)uVar5;
    uVar2 = uVar1 >> 3 & 2;
    uVar3 = uVar2 + uVar5 + 4;
    if (bVar6 != 0) {
      uVar3 = uVar2 + uVar5;
    }
    CTcDataStream::write2(&G_cs->super_CTcDataStream,uVar3);
    this_00 = G_cs;
    uVar3 = CTcSymLocalBase::get_ctx_arr_idx(&this->super_CTcSymLocalBase);
    CTcDataStream::write2(&this_00->super_CTcDataStream,uVar3);
    __buf = extraout_RDX;
    for (iVar7 = G_sizes.lcl_hdr + -6; 0 < iVar7; iVar7 = iVar7 + -1) {
      CTcDataStream::write(&G_cs->super_CTcDataStream,0,__buf,__n);
      __buf = extraout_RDX_00;
    }
    if (bVar6 == 0) {
      pCVar4 = CTcDataStream::add_anchor(G_lcl_stream,(CTcSymbol *)0x0,(CTcAbsFixup **)0x0);
      CTcAbsFixup::add_abs_fixup
                (pCVar4->fixup_list_head_,&G_cs->super_CTcDataStream,
                 (G_cs->super_CTcDataStream).ofs_);
      CTcDataStream::write4(&G_cs->super_CTcDataStream,0);
      ppCVar8 = (CTcCodeStream **)&G_lcl_stream;
    }
    CTcDataStream::write2
              (&(*ppCVar8)->super_CTcDataStream,
               (uint)(this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.
                     super_CVmHashEntryCS.super_CVmHashEntry.len_);
    CTcDataStream::write
              (&(*ppCVar8)->super_CTcDataStream,
               (int)(this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.
                    super_CVmHashEntryCS.super_CVmHashEntry.str_,
               (void *)(this->super_CTcSymLocalBase).super_CTcSymbol.super_CTcSymbolBase.
                       super_CVmHashEntryCS.super_CVmHashEntry.len_,__n);
  }
  return 1;
}

Assistant:

int CTcSymLocal::write_to_debug_frame(int test_only)
{
    /* if this is test-only mode, just note that we will write it */
    if (test_only)
        return TRUE;

    /* 
     *   For version 2+ static compilation, write the symbol name
     *   out-of-line, to the separate stream for local variable names.  This
     *   allows us to consolidate the names so that each name is stored only
     *   once in the file.  This saves a lot of space since there are a few
     *   common local names that appear over and over.  Version 1 always
     *   wrote names in-line, and we also have to write the names in-line
     *   when generating dynamic code, since we can't add to the constant
     *   pool in this case.
     *   
     *   Also, store all 1- and 2-character names in-line.  1-character names
     *   are smaller if stored in-line since they'll take only three bytes
     *   (two bytes for the length, one byte for the string) vs four bytes
     *   for a shared pool pointer.  2-char names are a wash on the frame
     *   storage, but it's still more efficient to store them in-line because
     *   we avoid also creating the constant pool entry for them.  
     */
    int inl = (len_ <= 2
               || G_sizes.dbg_fmt_vsn < 2
               || G_cg->is_eval_for_dyn());
    
    /* 
     *   write my ID - if we're a context variable, we want to write the
     *   context variable ID; otherwise write our stack location as normal 
     */
    if (is_ctx_local_)
        G_cs->write2(ctx_var_num_);
    else
        G_cs->write2(var_num_);

    /* compute my flags */
    int flags = 0;
    if (is_param_)
        flags |= 0x0001;
    if (is_ctx_local_)
        flags |= 0x0002;
    if (!inl)
        flags |= 0x0004;

    /* write my flags */
    G_cs->write2(flags);

    /* write my local context array index */
    G_cs->write2(get_ctx_arr_idx());

    /* add zeros to pad any future version information for the target VM */
    for (int i = G_sizes.lcl_hdr - 6 ; i > 0 ; --i)
        G_cs->write(0);

    /* 
     *   write the name - either to the separate stream for local names, or
     *   inline if necessary 
     */
    if (inl)
    {
        /* write the symbol name to the table in-line */
        G_cs->write2(len_);
        G_cs->write(str_, len_);
    }
    else
    {
        /* add a fixup from the table to the local stream */
        CTcStreamAnchor *anchor = G_lcl_stream->add_anchor(0, 0);
        CTcAbsFixup::add_abs_fixup(anchor->fixup_list_head_,
                                   G_cs, G_cs->get_ofs());

        /* add the placeholder to the table (this is what we fix up) */
        G_cs->write4(0);

        /* write the name to the local stream */
        G_lcl_stream->write2(len_);
        G_lcl_stream->write(str_, len_);
    }

    /* we did write this symbol */
    return TRUE;
}